

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O0

bool __thiscall DTreeParenthoodPropagator::propagate(DTreeParenthoodPropagator *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  reference piVar6;
  ulong uVar7;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  DTreePropagator *in_stack_00000078;
  iterator it;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  GraphPropagator *in_stack_ffffffffffffff50;
  IntVar *in_stack_ffffffffffffff58;
  IntVar *this_00;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  _Self local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  undefined1 local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<int> local_18 [3];
  
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(local_18);
  local_20 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_18[0]._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar2 = std::operator!=(local_18,&local_28);
    if (!bVar2) {
      local_40 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_18[0]._M_node = local_40;
      while( true ) {
        local_48._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        bVar2 = std::operator!=(local_18,&local_48);
        if (!bVar2) {
          bVar2 = DTreePropagator::propagate(in_stack_00000078);
          return bVar2;
        }
        piVar6 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x2078a4);
        uVar7 = (**(code **)(*in_RDI + 0xd0))(in_RDI,*piVar6);
        if ((uVar7 & 1) == 0) break;
        this_00 = (IntVar *)(in_RDI + 0x4a);
        std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2078e2);
        uVar3 = GraphPropagator::getHead(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        vec<IntVar_*>::operator[]((vec<IntVar_*> *)this_00,uVar3);
        iVar4 = IntVar::size(this_00);
        std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x207926);
        GraphPropagator::getHead(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        Tint::operator=((Tint *)in_stack_ffffffffffffff70,iVar4);
        in_stack_ffffffffffffff70 = (set<int,_std::less<int>,_std::allocator<int>_> *)in_RDI[0x1a];
        piVar6 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x207967);
        iVar5 = Tint::operator_cast_to_int
                          ((Tint *)((long)&(in_stack_ffffffffffffff70->_M_t)._M_impl.field_0x0 +
                                   (long)*piVar6 * 4));
        if (iVar5 != 1) {
          in_stack_ffffffffffffff50 = (GraphPropagator *)(in_RDI + 0x2d);
          std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x20799d);
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (in_stack_ffffffffffffff70,
                     (value_type_conflict *)CONCAT44(iVar4,in_stack_ffffffffffffff68));
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff50);
      }
      return false;
    }
    piVar6 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2076c6);
    uVar7 = (**(code **)(*in_RDI + 0xd8))(in_RDI,*piVar6);
    if ((uVar7 & 1) == 0) break;
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x207704);
    uVar3 = GraphPropagator::getHead(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x4a),uVar3);
    IntVar::size(in_stack_ffffffffffffff58);
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x207748);
    GraphPropagator::getHead(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    Tint::operator=((Tint *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    lVar1 = in_RDI[0x1a];
    piVar6 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x207789);
    iVar4 = Tint::operator_cast_to_int((Tint *)(lVar1 + (long)*piVar6 * 4));
    if (iVar4 != 0) {
      std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2077b3);
      GraphPropagator::getEdgeVar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      bVar2 = BoolView::isFixed((BoolView *)0x2077c7);
      if (bVar2) {
        std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2077da);
        GraphPropagator::getEdgeVar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        bVar2 = BoolView::isTrue((BoolView *)in_stack_ffffffffffffff50);
        if (bVar2) {
          std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x207811);
          pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            (in_stack_ffffffffffffff70,
                             (value_type_conflict *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          local_38 = (_Base_ptr)pVar8.first._M_node;
          local_30 = pVar8.second;
        }
      }
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff50);
  }
  return false;
}

Assistant:

bool DTreeParenthoodPropagator::propagate() {
	std::set<int>::iterator it;
	//*
	for (it = parenthood_fixed.begin(); it != parenthood_fixed.end(); ++it) {
		if (!propagateNewParent(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		dom_size[getHead(*it)] = parents[getHead(*it)]->size();
		if (last_state_e[*it] != VT_IN) {
			assert(getHead(*it) == getTail(*it) || getEdgeVar(*it).isFixed());
			assert(getHead(*it) == getTail(*it) || getEdgeVar(*it).isTrue());
			if (getEdgeVar(*it).isFixed() && getEdgeVar(*it).isTrue()) {
				new_edge.insert(*it);
			}
		}
	}

	for (it = parenthood_abandon.begin(); it != parenthood_abandon.end(); ++it) {
		if (!propagateRemParent(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		dom_size[getHead(*it)] = parents[getHead(*it)]->size();
		if (last_state_e[*it] != VT_OUT) {
			assert(getEdgeVar(*it).isFixed());
			assert(getEdgeVar(*it).isFalse());
			rem_edge.insert(*it);
		}
	}
	//*/

	if (!DTreePropagator::propagate()) {
		if (DEBUG) {
			std::cout << "False " << __FILE__ << __LINE__ << '\n';
		}
		return false;
	}

	return true;
}